

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall
Js::InlineCache::CopyTo
          (InlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,InlineCache *clone)

{
  Type *pTVar1;
  bool bVar2;
  int iVar3;
  
  VerifyRegistrationForInvalidation(this,scriptContext,propertyId);
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  if ((this->invalidationListSlotPtr != (InlineCache **)0x0) &&
     (clone->invalidationListSlotPtr == (InlineCache **)0x0)) {
    if (((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0) && (((this->u).accessor.field_1.rawUInt16 & 0xb) != 0xb)) {
      bVar2 = NeedsToBeRegisteredForStoreFieldInvalidation(this);
      if (bVar2) {
        ScriptContext::RegisterStoreFieldInlineCache(scriptContext,clone,propertyId);
      }
    }
    else {
      ScriptContext::RegisterProtoInlineCache(scriptContext,clone,propertyId);
    }
  }
  iVar3 = bcmp(clone,this,0x18);
  if (iVar3 != 0) {
    (clone->u).proto.prototypeObject = (this->u).proto.prototypeObject;
    pTVar1 = (this->u).local.typeWithoutProperty;
    (clone->u).local.type = (this->u).local.type;
    (clone->u).local.typeWithoutProperty = pTVar1;
  }
  VerifyRegistrationForInvalidation(clone,scriptContext,propertyId);
  return;
}

Assistant:

void InlineCache::CopyTo(PropertyId propertyId, ScriptContext * scriptContext, InlineCache * const clone)
    {
        DebugOnly(VerifyRegistrationForInvalidation(this, scriptContext, propertyId));
        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
        Assert(clone != nullptr);

        // Note, the Register methods can throw due to OOM, so we need to do it before the inline cache is copied below.
        if (this->invalidationListSlotPtr != nullptr && clone->invalidationListSlotPtr == nullptr)
        {
            if (this->NeedsToBeRegisteredForProtoInvalidation())
            {
                scriptContext->RegisterProtoInlineCache(clone, propertyId);
            }
            else if (this->NeedsToBeRegisteredForStoreFieldInvalidation())
            {
                scriptContext->RegisterStoreFieldInlineCache(clone, propertyId);
            }
        }

#if DBG
        // inline cache pages might been locked after ZeroAll
        if (memcmp(&clone->u, &this->u, sizeof(this->u)) != 0)
#endif
        {
            clone->u = this->u;
        }

        DebugOnly(VerifyRegistrationForInvalidation(clone, scriptContext, propertyId));
    }